

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

Socket * sk_newlistener(char *srcaddr,int port,Plug *plug,_Bool param_4,int orig_address_family)

{
  int fd;
  int iVar1;
  NetSocket *s;
  char *pcVar2;
  Socket *pSVar3;
  int *piVar4;
  uchar (*pauVar5) [8];
  socklen_t __len;
  int __domain;
  sockaddr_union *__addr;
  Socket *pSVar6;
  addrinfo *ai;
  int local_100;
  int on;
  Plug *local_f8;
  char portstr [6];
  addrinfo local_e8;
  sockaddr_union u;
  
  ai = (addrinfo *)0x0;
  on = 1;
  s = (NetSocket *)safemalloc(1,0x98,0);
  (s->sock).vt = &NetSocket_sockvt;
  s->error = (char *)0x0;
  s->plug = plug;
  bufchain_init(&s->output_data);
  s->writable = false;
  s->frozen = false;
  s->sending_oob = 0;
  s->localhost_only = param_4;
  s->pending_error = 0;
  s->oobpending = false;
  s->outgoingeof = EOF_NO;
  s->incomingeof = false;
  s->parent = (NetSocket *)0x0;
  s->child = (NetSocket *)0x0;
  s->listener = true;
  s->addr = (SockAddr *)0x0;
  s->s = -1;
  __domain = 0;
  if (orig_address_family == 2) {
    __domain = 10;
  }
  if (orig_address_family == 1) {
    __domain = 2;
  }
  if (__domain == 0) {
    __domain = 10;
  }
  local_100 = orig_address_family;
  fd = socket(__domain,1,0);
  if (__domain == 10 && fd < 0) {
    fd = socket(2,1,0);
    __domain = 2;
  }
  pSVar6 = &s->sock;
  if (fd < 0) goto LAB_00143e22;
  cloexec(fd);
  s->oobinline = false;
  iVar1 = setsockopt(fd,1,2,&on,4);
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    s->error = pcVar2;
    close(fd);
    return pSVar6;
  }
  if (srcaddr == (char *)0x0) {
LAB_00143cd8:
    u._112_8_ = 0;
    u.storage.__ss_align = 0;
    u._96_8_ = 0;
    u._104_8_ = 0;
    u._80_8_ = 0;
    u._88_8_ = 0;
    u._64_8_ = 0;
    u._72_8_ = 0;
    u._48_8_ = 0;
    u._56_8_ = 0;
    u._32_8_ = 0;
    u._40_8_ = 0;
    u._16_8_ = 0;
    u._24_8_ = 0;
    u._8_1_ = '\0';
    u._9_1_ = '\0';
    u._10_1_ = '\0';
    u._11_1_ = '\0';
    u._12_1_ = '\0';
    u._13_1_ = '\0';
    u._14_1_ = '\0';
    u._15_1_ = '\0';
    u.sin.sin_port = (ushort)port << 8 | (ushort)port >> 8;
    if (__domain == 10) {
      u.storage.ss_family = 10;
      u.sin6.sin6_flowinfo = 0;
      if (param_4) {
        pauVar5 = (uchar (*) [8])&in6addr_loopback;
      }
      else {
        pauVar5 = (uchar (*) [8])&in6addr_any;
      }
      u.sin.sin_zero = *pauVar5;
      u._16_8_ = pauVar5[1];
      __addr = &u;
      __len = 0x1c;
    }
    else {
      __addr = &u;
      u.storage.ss_family = 2;
      u.sin6.sin6_flowinfo = 0;
      __len = 0x10;
      if (param_4) {
        u.sin6.sin6_flowinfo = 0x100007f;
      }
    }
  }
  else {
    local_e8.ai_flags = 4;
    local_e8.ai_socktype = 1;
    local_e8.ai_protocol = 0;
    local_e8.ai_addrlen = 0;
    local_e8.ai_next = (addrinfo *)0x0;
    local_e8.ai_addr = (sockaddr *)0x0;
    local_e8.ai_canonname = (char *)0x0;
    local_f8 = plug;
    local_e8.ai_family = __domain;
    if (99999 < (uint)port) {
      __assert_fail("port >= 0 && port <= 99999",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                    ,0x37c,"Socket *sk_newlistener(const char *, int, Plug *, _Bool, int)");
    }
    sprintf(portstr,"%d",(ulong)(uint)port);
    pcVar2 = host_strduptrim(srcaddr);
    iVar1 = getaddrinfo(pcVar2,portstr,&local_e8,(addrinfo **)&ai);
    safefree(pcVar2);
    plug = local_f8;
    if (iVar1 != 0) goto LAB_00143cd8;
    __addr = (sockaddr_union *)ai->ai_addr;
    __len = ai->ai_addrlen;
  }
  iVar1 = bind(fd,(sockaddr *)&__addr->storage,__len);
  if (ai != (addrinfo *)0x0) {
    freeaddrinfo((addrinfo *)ai);
  }
  if ((-1 < iVar1) && (iVar1 = listen(fd,0x1000), -1 < iVar1)) {
    if ((local_100 == 0) && (__domain == 10)) {
      pSVar3 = sk_newlistener(srcaddr,port,plug,param_4,1);
      if (pSVar3[-0x12].vt != (SocketVtable *)0x0) {
        close(fd);
        safefree(s);
        return pSVar3;
      }
      pSVar3[-2].vt = (SocketVtable *)s;
      s->child = (NetSocket *)(pSVar3 + -0x12);
    }
    s->s = fd;
    uxsel_tell(s);
    add234(sktree,s);
    return pSVar6;
  }
  close(fd);
LAB_00143e22:
  piVar4 = __errno_location();
  pcVar2 = strerror(*piVar4);
  s->error = pcVar2;
  return pSVar6;
}

Assistant:

Socket *sk_newlistener(const char *srcaddr, int port, Plug *plug,
                       bool local_host_only, int orig_address_family)
{
    int s;
#ifndef NO_IPV6
    struct addrinfo hints, *ai = NULL;
    char portstr[6];
#endif
    union sockaddr_union u;
    union sockaddr_union *addr;
    int addrlen;
    NetSocket *ret;
    int retcode;
    int address_family;
    int on = 1;

    /*
     * Create NetSocket structure.
     */
    ret = snew(NetSocket);
    ret->sock.vt = &NetSocket_sockvt;
    ret->error = NULL;
    ret->plug = plug;
    bufchain_init(&ret->output_data);
    ret->writable = false;             /* to start with */
    ret->sending_oob = 0;
    ret->frozen = false;
    ret->localhost_only = local_host_only;
    ret->pending_error = 0;
    ret->parent = ret->child = NULL;
    ret->oobpending = false;
    ret->outgoingeof = EOF_NO;
    ret->incomingeof = false;
    ret->listener = true;
    ret->addr = NULL;
    ret->s = -1;

    /*
     * Translate address_family from platform-independent constants
     * into local reality.
     */
    address_family = (orig_address_family == ADDRTYPE_IPV4 ? AF_INET :
#ifndef NO_IPV6
                      orig_address_family == ADDRTYPE_IPV6 ? AF_INET6 :
#endif
                      AF_UNSPEC);

#ifndef NO_IPV6
    /* Let's default to IPv6.
     * If the stack doesn't support IPv6, we will fall back to IPv4. */
    if (address_family == AF_UNSPEC) address_family = AF_INET6;
#else
    /* No other choice, default to IPv4 */
    if (address_family == AF_UNSPEC)  address_family = AF_INET;
#endif

    /*
     * Open socket.
     */
    s = socket(address_family, SOCK_STREAM, 0);

#ifndef NO_IPV6
    /* If the host doesn't support IPv6 try fallback to IPv4. */
    if (s < 0 && address_family == AF_INET6) {
        address_family = AF_INET;
        s = socket(address_family, SOCK_STREAM, 0);
    }
#endif

    if (s < 0) {
        ret->error = strerror(errno);
        return &ret->sock;
    }

    cloexec(s);

    ret->oobinline = false;

    if (setsockopt(s, SOL_SOCKET, SO_REUSEADDR,
                   (const char *)&on, sizeof(on)) < 0) {
        ret->error = strerror(errno);
        close(s);
        return &ret->sock;
    }

    retcode = -1;
    addr = NULL; addrlen = -1;         /* placate optimiser */

    if (srcaddr != NULL) {
#ifndef NO_IPV6
        hints.ai_flags = AI_NUMERICHOST;
        hints.ai_family = address_family;
        hints.ai_socktype = SOCK_STREAM;
        hints.ai_protocol = 0;
        hints.ai_addrlen = 0;
        hints.ai_addr = NULL;
        hints.ai_canonname = NULL;
        hints.ai_next = NULL;
        assert(port >= 0 && port <= 99999);
        sprintf(portstr, "%d", port);
        {
            char *trimmed_addr = host_strduptrim(srcaddr);
            retcode = getaddrinfo(trimmed_addr, portstr, &hints, &ai);
            sfree(trimmed_addr);
        }
        if (retcode == 0) {
            addr = (union sockaddr_union *)ai->ai_addr;
            addrlen = ai->ai_addrlen;
        }
#else
        memset(&u,'\0',sizeof u);
        u.sin.sin_family = AF_INET;
        u.sin.sin_port = htons(port);
        u.sin.sin_addr.s_addr = inet_addr(srcaddr);
        if (u.sin.sin_addr.s_addr != (in_addr_t)(-1)) {
            /* Override localhost_only with specified listen addr. */
            ret->localhost_only = ipv4_is_loopback(u.sin.sin_addr);
        }
        addr = &u;
        addrlen = sizeof(u.sin);
        retcode = 0;
#endif
    }

    if (retcode != 0) {
        memset(&u,'\0',sizeof u);
#ifndef NO_IPV6
        if (address_family == AF_INET6) {
            u.sin6.sin6_family = AF_INET6;
            u.sin6.sin6_port = htons(port);
            if (local_host_only)
                u.sin6.sin6_addr = in6addr_loopback;
            else
                u.sin6.sin6_addr = in6addr_any;
            addr = &u;
            addrlen = sizeof(u.sin6);
        } else
#endif
        {
            u.sin.sin_family = AF_INET;
            u.sin.sin_port = htons(port);
            if (local_host_only)
                u.sin.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
            else
                u.sin.sin_addr.s_addr = htonl(INADDR_ANY);
            addr = &u;
            addrlen = sizeof(u.sin);
        }
    }

    retcode = bind(s, &addr->sa, addrlen);

#ifndef NO_IPV6
    if (ai)
        freeaddrinfo(ai);
#endif

    if (retcode < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

    if (listen(s, SOMAXCONN) < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

#ifndef NO_IPV6
    /*
     * If we were given ADDRTYPE_UNSPEC, we must also create an
     * IPv4 listening socket and link it to this one.
     */
    if (address_family == AF_INET6 && orig_address_family == ADDRTYPE_UNSPEC) {
        NetSocket *other;

        other = container_of(
            sk_newlistener(srcaddr, port, plug,
                           local_host_only, ADDRTYPE_IPV4),
            NetSocket, sock);

        if (other) {
            if (!other->error) {
                other->parent = ret;
                ret->child = other;
            } else {
                /* If we couldn't create a listening socket on IPv4 as well
                 * as IPv6, we must return an error overall. */
                close(s);
                sfree(ret);
                return &other->sock;
            }
        }
    }
#endif

    ret->s = s;

    uxsel_tell(ret);
    add234(sktree, ret);

    return &ret->sock;
}